

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigslot.h
# Opt level: O2

void __thiscall
sigslot::
_signal_base2<cursespp::TextInput_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
::slot_duplicate(_signal_base2<cursespp::TextInput_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
                 *this,has_slots<sigslot::multi_threaded_local> *oldtarget,
                has_slots<sigslot::multi_threaded_local> *newtarget)

{
  has_slots<sigslot::multi_threaded_local> *phVar1;
  _List_node_base *p_Var2;
  connections_list *this_00;
  lock_block<sigslot::multi_threaded_local> lock;
  lock_block<sigslot::multi_threaded_local> local_38;
  value_type local_30;
  
  local_38.m_mutex = (multi_threaded_local *)this;
  (*(this->super__signal_base<sigslot::multi_threaded_local>).super_multi_threaded_local.
    _vptr_multi_threaded_local[2])();
  this_00 = &this->m_connected_slots;
  p_Var2 = (_List_node_base *)this_00;
  while (p_Var2 = (((_List_base<sigslot::_connection_base2<cursespp::TextInput_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base2<cursespp::TextInput_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>_>
                     *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)this_00) {
    phVar1 = (has_slots<sigslot::multi_threaded_local> *)
             (**(code **)(*(long *)p_Var2[1]._M_next + 0x10))();
    if (phVar1 == oldtarget) {
      local_30 = (value_type)
                 (**(code **)(*(long *)p_Var2[1]._M_next + 0x28))(p_Var2[1]._M_next,newtarget);
      std::__cxx11::
      list<sigslot::_connection_base2<cursespp::TextInput_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base2<cursespp::TextInput_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>_>
      ::push_back(this_00,&local_30);
    }
  }
  lock_block<sigslot::multi_threaded_local>::~lock_block(&local_38);
  return;
}

Assistant:

void slot_duplicate(const has_slots<mt_policy>* oldtarget, has_slots<mt_policy>* newtarget)
		{
			lock_block<mt_policy> lock(this);
			iterator it = m_connected_slots.begin();
			iterator itEnd = m_connected_slots.end();

			while(it != itEnd)
			{
				if((*it)->getdest() == oldtarget)
				{
					m_connected_slots.push_back((*it)->duplicate(newtarget));
				}

				++it;
			}
		}